

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  bool bVar1;
  LogMessage *other;
  byte *pbVar2;
  uint8_t *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte *ptr;
  ulong uVar7;
  LogFinisher local_59;
  LogMessage local_58;
  
  uVar6 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  *pbVar2 = (byte)uVar6 | 2;
  if (uVar6 < 0x80) {
    ptr = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar6 | 0x82;
    pbVar2[1] = (byte)(uVar6 >> 7);
    ptr = pbVar2 + 2;
    if (0x3fff < uVar6) {
      uVar4 = (uint)pbVar2[1];
      uVar6 = uVar6 >> 7;
      do {
        ptr[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar6 >> 7;
        *ptr = (byte)uVar4;
        ptr = ptr + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar1);
    }
  }
  output->cur_ = ptr;
  uVar7 = value->_M_string_length;
  if ((uVar7 & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1ee);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (value.size()) <= (kInt32MaxSize): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
    uVar7 = value->_M_string_length;
    ptr = output->cur_;
  }
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *ptr = (byte)uVar7;
  if ((uint)uVar7 < 0x80) {
    pbVar2 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar7 | 0x80;
    uVar5 = uVar7 >> 7 & 0x1ffffff;
    ptr[1] = (byte)uVar5;
    pbVar2 = ptr + 2;
    if (0x3fff < (uint)uVar7) {
      uVar7 = (ulong)ptr[1];
      do {
        pbVar2[-1] = (byte)uVar7 | 0x80;
        uVar7 = uVar5 >> 7;
        *pbVar2 = (byte)uVar7;
        pbVar2 = pbVar2 + 1;
        uVar6 = (uint)uVar5;
        uVar5 = uVar7;
      } while (0x3fff < uVar6);
    }
  }
  output->cur_ = pbVar2;
  puVar3 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,(value->_M_dataplus)._M_p,(int)value->_M_string_length,pbVar2);
  output->cur_ = puVar3;
  return;
}

Assistant:

void WireFormatLite::WriteStringMaybeAliased(int field_number,
                                             const std::string& value,
                                             io::CodedOutputStream* output) {
  // String is for UTF-8 text only
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}